

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

void int_linear(vec<int> *_a,vec<IntVar_*> *_x,IntRelType t,IntVar *y,BoolView *r)

{
  uint uVar1;
  uint uVar2;
  vec<IntVar_*> *in_RSI;
  vec<int> *in_RDI;
  uint i_1;
  vec<IntVar_*> x;
  uint i;
  vec<int> a;
  BoolView *in_stack_000000c8;
  int in_stack_000000d0;
  IntRelType in_stack_000000d4;
  vec<IntVar_*> *in_stack_000000d8;
  vec<int> *in_stack_000000e0;
  IntVar **in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar3;
  uint local_64;
  vec<IntVar_*> local_60;
  undefined4 local_50;
  uint local_3c;
  vec<int> local_38 [2];
  vec<IntVar_*> *local_10;
  vec<int> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  vec<int>::vec(local_38);
  local_3c = 0;
  while( true ) {
    uVar3 = local_3c;
    uVar1 = vec<int>::size(local_8);
    if (uVar1 <= uVar3) break;
    in_stack_ffffffffffffff88 = (IntVar **)vec<int>::operator[](local_8,local_3c);
    vec<int>::push((vec<int> *)CONCAT44(uVar3,in_stack_ffffffffffffff90),
                   (int *)in_stack_ffffffffffffff88);
    local_3c = local_3c + 1;
  }
  local_50 = 0xffffffff;
  vec<int>::push((vec<int> *)CONCAT44(uVar3,in_stack_ffffffffffffff90),
                 (int *)in_stack_ffffffffffffff88);
  vec<IntVar_*>::vec(&local_60);
  local_64 = 0;
  while( true ) {
    uVar1 = local_64;
    uVar2 = vec<IntVar_*>::size(local_10);
    if (uVar2 <= uVar1) break;
    vec<IntVar_*>::operator[](local_10,local_64);
    vec<IntVar_*>::push((vec<IntVar_*> *)CONCAT44(uVar3,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff88);
    local_64 = local_64 + 1;
  }
  vec<IntVar_*>::push((vec<IntVar_*> *)CONCAT44(uVar3,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88);
  int_linear(in_stack_000000e0,in_stack_000000d8,in_stack_000000d4,in_stack_000000d0,
             in_stack_000000c8);
  vec<IntVar_*>::~vec((vec<IntVar_*> *)CONCAT44(uVar2,uVar1));
  vec<int>::~vec((vec<int> *)CONCAT44(uVar2,uVar1));
  return;
}

Assistant:

void int_linear(vec<int>& _a, vec<IntVar*>& _x, IntRelType t, IntVar* y, const BoolView& r) {
	vec<int> a;
	for (unsigned int i = 0; i < _a.size(); i++) {
		a.push(_a[i]);
	}
	a.push(-1);
	vec<IntVar*> x;
	for (unsigned int i = 0; i < _x.size(); i++) {
		x.push(_x[i]);
	}
	x.push(y);
	int_linear(a, x, t, 0, r);
}